

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O2

void __thiscall cmCTestLaunchReporter::~cmCTestLaunchReporter(cmCTestLaunchReporter *this)

{
  if (this->Passthru == false) {
    cmsys::SystemTools::RemoveFile(&this->LogOut);
    cmsys::SystemTools::RemoveFile(&this->LogErr);
  }
  std::__cxx11::string::~string((string *)&this->SourceDir);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&this->RegexWarningSuppress);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&this->RegexWarning);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->Labels)._M_t);
  std::__cxx11::string::~string((string *)&this->LogErr);
  std::__cxx11::string::~string((string *)&this->LogOut);
  std::__cxx11::string::~string((string *)&this->LogDir);
  std::__cxx11::string::~string((string *)&this->LogHash);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->RealArgs);
  std::__cxx11::string::~string((string *)&this->CWD);
  std::__cxx11::string::~string((string *)&this->OptionFilterPrefix);
  std::__cxx11::string::~string((string *)&this->OptionBuildDir);
  std::__cxx11::string::~string((string *)&this->OptionTargetType);
  std::__cxx11::string::~string((string *)&this->OptionTargetName);
  std::__cxx11::string::~string((string *)&this->OptionLanguage);
  std::__cxx11::string::~string((string *)&this->OptionSource);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmCTestLaunchReporter::~cmCTestLaunchReporter()
{
  if (!this->Passthru) {
    cmSystemTools::RemoveFile(this->LogOut);
    cmSystemTools::RemoveFile(this->LogErr);
  }
}